

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

uchar * __thiscall MD5::MD5(MD5 *this,uchar *d,size_t n,uchar *md)

{
  MD5 *pMVar1;
  
  this->finalized = false;
  this->count[0] = 0;
  this->count[1] = 0;
  this->state[0] = 0x67452301;
  this->state[1] = 0xefcdab89;
  this->state[2] = 0x98badcfe;
  this->state[3] = 0x10325476;
  update(this,*(uchar **)d,*(size_type *)(d + 8));
  pMVar1 = finalize(this);
  return &pMVar1->finalized;
}

Assistant:

MD5::MD5(const std::string &text)
{
  init();
  update(text.c_str(), text.length());
  finalize();
}